

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::JSONParser::ParseExpectedValue
          (JSONParser *this,ExpectedValue *out_value,AllowExpected allow_expected)

{
  Type type_00;
  ValueType VVar1;
  Result RVar2;
  uint uVar3;
  Enum EVar4;
  int lane;
  uint lane_00;
  string_view value_str_00;
  string_view value_str_01;
  Type type;
  Type lane_type;
  string value_str;
  
  value_str._M_dataplus._M_p = (pointer)&value_str.field_2;
  value_str._M_string_length = 0;
  value_str.field_2._M_local_buf[0] = '\0';
  RVar2 = Expect(this,"{");
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    RVar2 = ExpectKey(this,"type");
    if (RVar2.enum_ != Error) {
      RVar2 = ParseType(this,&type);
      if (RVar2.enum_ != Error) {
        RVar2 = Expect(this,",");
        if (RVar2.enum_ != Error) {
          if (type.enum_ == V128) {
            RVar2 = ExpectKey(this,"lane_type");
            if (RVar2.enum_ == Error) goto LAB_001191d9;
            RVar2 = ParseType(this,&lane_type);
            if (RVar2.enum_ == Error) goto LAB_001191d9;
            RVar2 = Expect(this,",");
            if (RVar2.enum_ == Error) goto LAB_001191d9;
            RVar2 = ExpectKey(this,"value");
            if (RVar2.enum_ == Error) goto LAB_001191d9;
            RVar2 = Expect(this,"[");
            if (RVar2.enum_ == Error) goto LAB_001191d9;
            uVar3 = LaneCountFromType(lane_type);
            for (lane_00 = 0; uVar3 != lane_00; lane_00 = lane_00 + 1) {
              RVar2 = ParseString(this,&value_str);
              if (RVar2.enum_ == Error) goto LAB_001191d9;
              value_str_00._M_str = value_str._M_dataplus._M_p;
              value_str_00._M_len = value_str._M_string_length;
              RVar2 = ParseLaneConstValue(this,lane_type,lane_00,out_value,value_str_00,
                                          allow_expected);
              if (RVar2.enum_ == Error) goto LAB_001191d9;
              if (lane_00 < uVar3 - 1) {
                RVar2 = Expect(this,",");
                if (RVar2.enum_ == Error) goto LAB_001191d9;
              }
            }
            RVar2 = Expect(this,"]");
            if (RVar2.enum_ == Error) goto LAB_001191d9;
            VVar1.type_index_ = type.type_index_;
            VVar1.enum_ = type.enum_;
            (out_value->value).type = VVar1;
            out_value->lane_type = lane_type;
          }
          else {
            RVar2 = ParseKeyStringValue(this,"value",&value_str);
            if (RVar2.enum_ == Error) goto LAB_001191d9;
            type_00.type_index_ = type.type_index_;
            type_00.enum_ = type.enum_;
            value_str_01._M_str = value_str._M_dataplus._M_p;
            value_str_01._M_len = value_str._M_string_length;
            RVar2 = ParseConstValue(this,type_00,&(out_value->value).value,out_value->nan,
                                    value_str_01,allow_expected);
            if (RVar2.enum_ == Error) goto LAB_001191d9;
            (out_value->value).type.enum_ = type.enum_;
            (out_value->value).type.type_index_ = type.type_index_;
          }
          RVar2 = Expect(this,"}");
          EVar4 = (Enum)(RVar2.enum_ == Error);
        }
      }
    }
  }
LAB_001191d9:
  std::__cxx11::string::_M_dispose();
  return (Result)EVar4;
}

Assistant:

wabt::Result JSONParser::ParseExpectedValue(ExpectedValue* out_value,
                                            AllowExpected allow_expected) {
  Type type;
  std::string value_str;
  EXPECT("{");
  EXPECT_KEY("type");
  CHECK_RESULT(ParseType(&type));
  EXPECT(",");
  if (type == Type::V128) {
    Type lane_type;
    EXPECT_KEY("lane_type");
    CHECK_RESULT(ParseType(&lane_type));
    EXPECT(",");
    EXPECT_KEY("value");
    EXPECT("[");

    int lane_count = LaneCountFromType(lane_type);
    for (int lane = 0; lane < lane_count; ++lane) {
      CHECK_RESULT(ParseString(&value_str));
      CHECK_RESULT(ParseLaneConstValue(lane_type, lane, out_value, value_str,
                                       allow_expected));
      if (lane < lane_count - 1) {
        EXPECT(",");
      }
    }
    EXPECT("]");
    out_value->value.type = type;
    out_value->lane_type = lane_type;
  } else {
    PARSE_KEY_STRING_VALUE("value", &value_str);
    CHECK_RESULT(ParseConstValue(type, &out_value->value.value,
                                 &out_value->nan[0], value_str,
                                 allow_expected));
    out_value->value.type = type;
  }
  EXPECT("}");

  return wabt::Result::Ok;
}